

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  byte *pbVar1;
  u8 uVar2;
  short sVar3;
  ushort uVar4;
  Parse *pParse;
  Vdbe *p;
  WhereLoop *pWVar5;
  SrcList *pSVar6;
  Vdbe *p_00;
  Index *pIVar7;
  Table *pTVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  long lVar13;
  int *piVar14;
  Op *pOVar15;
  uint nReg;
  WhereTerm *pWVar16;
  Bitmask BVar17;
  ulong uVar18;
  WhereTerm *pWVar19;
  int iVar20;
  char *pcVar21;
  StrAccum local_f0;
  Bitmask local_d0;
  WhereLoop *local_c8;
  int *local_c0;
  int *local_b8;
  WhereLevel *local_b0;
  WhereLevel *local_a8;
  undefined8 local_a0;
  char local_98 [104];
  
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar5 = pLevel->pWLoop;
  local_d0 = notReady;
  iVar10 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  local_c0 = pParse->aTempReg;
  local_b8 = &pParse->iRangeReg;
  local_f0.db = pParse->db;
  local_b0 = pWInfo->a;
  local_c8 = pWVar5;
  do {
    pSVar6 = pWInfo->pTabList;
    bVar9 = pLevel->iFrom;
    p_00 = pParse->pVdbe;
    local_f0.zText = local_98;
    local_f0.nAlloc = 100;
    local_f0.mxAlloc = 1000000000;
    local_f0.nChar = 0;
    local_f0.accError = '\0';
    local_f0.printfFlags = '\x01';
    sqlite3_str_appendf(&local_f0,"BLOOM FILTER ON %S (",pSVar6->a + bVar9);
    pWVar5 = pLevel->pWLoop;
    if ((pWVar5->wsFlags & 0x100) == 0) {
      uVar18 = (ulong)pWVar5->nSkip;
      if (pWVar5->nSkip < (pWVar5->u).btree.nEq) {
        do {
          pIVar7 = (pWVar5->u).btree.pIndex;
          sVar3 = pIVar7->aiColumn[uVar18];
          pcVar21 = "<expr>";
          if (sVar3 != -2) {
            if (sVar3 == -1) {
              pcVar21 = "rowid";
            }
            else {
              pcVar21 = pIVar7->pTable->aCol[sVar3].zCnName;
            }
          }
          if (pWVar5->nSkip < uVar18) {
            if (local_f0.nChar + 5 < local_f0.nAlloc) {
              builtin_strncpy(local_f0.zText + local_f0.nChar," AND ",5);
              local_f0.nChar = local_f0.nChar + 5;
            }
            else {
              enlargeAndAppend(&local_f0," AND ",5);
            }
          }
          sqlite3_str_appendf(&local_f0,"%s=?",pcVar21);
          uVar18 = uVar18 + 1;
        } while (uVar18 < (pWVar5->u).btree.nEq);
      }
    }
    else {
      pTVar8 = pSVar6->a[bVar9].pTab;
      lVar13 = (long)pTVar8->iPKey;
      if (lVar13 < 0) {
        sqlite3_str_appendf(&local_f0,"rowid=?");
      }
      else {
        sqlite3_str_appendf(&local_f0,"%s=?",pTVar8->aCol[lVar13].zCnName);
      }
    }
    if (local_f0.nChar + 1 < local_f0.nAlloc) {
      local_f0.zText[local_f0.nChar] = ')';
      local_f0.nChar = local_f0.nChar + 1;
    }
    else {
      enlargeAndAppend(&local_f0,")",1);
    }
    pcVar21 = sqlite3StrAccumFinish(&local_f0);
    iVar11 = sqlite3VdbeAddOp3(p_00,0xb9,p_00->nOp,pParse->addrExplain,0);
    sqlite3VdbeChangeP4(p_00,iVar11,pcVar21,-6);
    iVar12 = pParse->nLabel + -1;
    pParse->nLabel = iVar12;
    iVar11 = pLevel->iTabCur;
    iVar20 = pParse->nMem + 1;
    pParse->nMem = iVar20;
    pLevel->regFilter = iVar20;
    pSVar6 = pWInfo->pTabList;
    bVar9 = pLevel->iFrom;
    uVar18 = sqlite3LogEstToInt((pSVar6->a[bVar9].pTab)->nRowLogEst);
    if (9999999 < uVar18) {
      uVar18 = 10000000;
    }
    if (uVar18 < 0x2711) {
      uVar18 = 10000;
    }
    sqlite3VdbeAddOp3(p,0x4d,(int)uVar18,iVar20,0);
    iVar20 = sqlite3VdbeAddOp3(p,0x24,iVar11,0,0);
    local_a0 = CONCAT44(extraout_var,iVar20);
    lVar13 = (long)(pWInfo->sWC).nTerm;
    if (0 < lVar13) {
      pWVar16 = (pWInfo->sWC).a;
      pWVar19 = pWVar16 + lVar13;
      do {
        if (((pWVar16->wtFlags & 2) == 0) &&
           (iVar20 = sqlite3ExprIsTableConstraint(pWVar16->pExpr,pSVar6->a + bVar9), iVar20 != 0)) {
          sqlite3ExprIfFalse(pParse,pWVar16->pExpr,iVar12,0x10);
        }
        pWVar16 = pWVar16 + 1;
      } while (pWVar16 < pWVar19);
    }
    BVar17 = local_d0;
    if ((local_c8->wsFlags & 0x100) == 0) {
      pIVar7 = (local_c8->u).btree.pIndex;
      uVar4 = (local_c8->u).btree.nEq;
      nReg = (uint)uVar4;
      local_a8 = pLevel;
      iVar20 = sqlite3GetTempRange(pParse,nReg);
      if (uVar4 != 0) {
        uVar18 = 0;
        do {
          sqlite3ExprCodeGetColumnOfTable
                    (p,pIVar7->pTable,iVar11,(int)pIVar7->aiColumn[uVar18],iVar20 + (int)uVar18);
          uVar18 = uVar18 + 1;
        } while (nReg != uVar18);
      }
      pLevel = local_a8;
      iVar11 = sqlite3VdbeAddOp3(p,0xb4,local_a8->regFilter,0,iVar20);
      if (p->db->mallocFailed == '\0') {
        pOVar15 = p->aOp;
        pOVar15[iVar11].p4type = -3;
        pOVar15[iVar11].p4.i = nReg;
      }
      BVar17 = local_d0;
      if (nReg == 1) {
        if (iVar20 != 0) {
          bVar9 = pParse->nTempReg;
          if ((ulong)bVar9 < 8) {
            pParse->nTempReg = bVar9 + 1;
            piVar14 = local_c0 + bVar9;
            goto LAB_0019e99f;
          }
        }
      }
      else if (pParse->nRangeReg < (int)nReg) {
        pParse->nRangeReg = nReg;
        piVar14 = local_b8;
LAB_0019e99f:
        *piVar14 = iVar20;
      }
    }
    else {
      if (pParse->nTempReg == '\0') {
        iVar20 = pParse->nMem + 1;
        pParse->nMem = iVar20;
      }
      else {
        bVar9 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar9;
        iVar20 = pParse->aTempReg[bVar9];
      }
      sqlite3VdbeAddOp3(p,0x87,iVar11,iVar20,0);
      iVar11 = sqlite3VdbeAddOp3(p,0xb4,pLevel->regFilter,0,iVar20);
      if (p->db->mallocFailed == '\0') {
        pOVar15 = p->aOp;
        pOVar15[iVar11].p4type = -3;
        pOVar15[iVar11].p4.i = 1;
      }
      if (iVar20 != 0) {
        bVar9 = pParse->nTempReg;
        if ((ulong)bVar9 < 8) {
          pParse->nTempReg = bVar9 + 1;
          pParse->aTempReg[bVar9] = iVar20;
        }
      }
    }
    sqlite3VdbeResolveLabel(p,iVar12);
    iVar12 = (int)local_a0;
    sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar12 + 1,0);
    iVar11 = p->nOp;
    uVar2 = p->db->mallocFailed;
    pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (uVar2 == '\0') {
      pOVar15 = p->aOp + iVar12;
    }
    pOVar15->p2 = iVar11;
    pbVar1 = (byte *)((long)&local_c8->wsFlags + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    local_f0.db = pParse->db;
    if (((local_f0.db)->dbOptFlags & 0x100000) != 0) break;
    bVar9 = pWInfo->nLevel;
    iLevel = iLevel + 1;
    if (iLevel < (int)(uint)bVar9) {
      pLevel = local_b0 + iLevel;
      lVar13 = 0;
      while (((((pWInfo->pTabList->a[pLevel->iFrom].fg.jointype & 0x48) != 0 ||
               (local_c8 = pLevel->pWLoop, local_c8 == (WhereLoop *)0x0)) ||
              ((local_c8->prereq & BVar17) != 0)) || ((local_c8->wsFlags & 0x400004) != 0x400000)))
      {
        lVar13 = lVar13 + -1;
        pLevel = pLevel + 1;
        if ((long)iLevel - (ulong)(uint)bVar9 == lVar13) goto LAB_0019eb21;
      }
      iLevel = iLevel - (int)lVar13;
    }
  } while (iLevel < (int)(uint)bVar9);
LAB_0019eb21:
  if (uVar2 == '\0') {
    pOVar15 = p->aOp + iVar10;
  }
  else {
    pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar15->p2 = iVar11;
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pItem = &pWInfo->pTabList->a[pLevel->iFrom];
    assert( pItem!=0 );
    pTab = pItem->pTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsTableConstraint(pExpr, pItem)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        int iCol = pIdx->aiColumn[jj];
        assert( pIdx->pTable==pItem->pTab );
        sqlite3ExprCodeGetColumnOfTable(v, pIdx->pTable, iCur, iCol,r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
}